

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cpp
# Opt level: O0

void __thiscall
NetworkNS::dump::add_snapshot_to_dump
          (dump *this,NetwMin *netw_app,cb3D_integrator *b3D,uint timestep)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  reference psVar4;
  uint uVar5;
  iterator iStack_38;
  uint ibead;
  _Self local_30;
  iterator it;
  uint timestep_local;
  cb3D_integrator *b3D_local;
  NetwMin *netw_app_local;
  dump *this_local;
  
  it._M_node._4_4_ = timestep;
  std::operator<<((ostream *)&this->my_file,"ITEM: TIMESTEP\n");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&this->my_file,it._M_node._4_4_);
  std::operator<<(poVar2,"\n");
  std::operator<<((ostream *)&this->my_file,"ITEM: NUMBER OF ATOMS\n");
  sVar3 = std::__cxx11::list<sNode,_std::allocator<sNode>_>::size(&netw_app->network->nodes);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&this->my_file,sVar3);
  std::operator<<(poVar2,"\n");
  std::operator<<((ostream *)&this->my_file,"ITEM: BOX BOUNDS pp pp pp\n");
  poVar2 = (ostream *)
           std::ostream::operator<<((ostream *)&this->my_file,netw_app->domain->BoxLow[0]);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,netw_app->domain->BoxHigh[0]);
  std::operator<<(poVar2,"\n");
  poVar2 = (ostream *)
           std::ostream::operator<<((ostream *)&this->my_file,netw_app->domain->BoxLow[1]);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,netw_app->domain->BoxHigh[1]);
  std::operator<<(poVar2,"\n");
  poVar2 = (ostream *)
           std::ostream::operator<<((ostream *)&this->my_file,netw_app->domain->BoxLow[2]);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,netw_app->domain->BoxHigh[2]);
  std::operator<<(poVar2,"\n");
  std::operator<<((ostream *)&this->my_file,
                  "ITEM: ATOMS id x y z ix iy iz Vor VorNeigh xx yy zz xy xz yz\n");
  std::ios_base::precision
            ((ios_base *)(&this->my_file + *(long *)(*(long *)&this->my_file + -0x18)),6);
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::list<sNode,_std::allocator<sNode>_>::begin(&netw_app->network->nodes);
  while( true ) {
    iStack_38 = std::__cxx11::list<sNode,_std::allocator<sNode>_>::end(&netw_app->network->nodes);
    bVar1 = std::operator!=(&local_30,&stack0xffffffffffffffc8);
    if (!bVar1) break;
    psVar4 = std::_List_iterator<sNode>::operator*(&local_30);
    uVar5 = psVar4->Id - 1;
    psVar4 = std::_List_iterator<sNode>::operator*(&local_30);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&this->my_file,psVar4->Id);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,b3D->bd_x[uVar5 * 3]);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,b3D->bd_x[uVar5 * 3 + 1]);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,b3D->bd_x[uVar5 * 3 + 2]);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::operator<<(poVar2," 0 0 0 1.0 0 ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*b3D->bd_stress[uVar5]);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,b3D->bd_stress[uVar5][1]);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,b3D->bd_stress[uVar5][2]);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,b3D->bd_stress[uVar5][3]);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,b3D->bd_stress[uVar5][4]);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,b3D->bd_stress[uVar5][5]);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::_List_iterator<sNode>::operator++(&local_30);
  }
  return;
}

Assistant:

void dump::add_snapshot_to_dump(const class NetwMin *netw_app, const class cb3D_integrator *b3D, 
                                   unsigned int timestep){
      
      my_file << "ITEM: TIMESTEP\n";
      my_file << timestep << "\n";
      my_file << "ITEM: NUMBER OF ATOMS\n";
      my_file << netw_app->network->nodes.size() << "\n";
      my_file << "ITEM: BOX BOUNDS pp pp pp\n";
      my_file << netw_app->domain->BoxLow[0] << " " << netw_app->domain->BoxHigh[0] << "\n";
      my_file << netw_app->domain->BoxLow[1] << " " << netw_app->domain->BoxHigh[1] << "\n";
      my_file << netw_app->domain->BoxLow[2] << " " << netw_app->domain->BoxHigh[2] << "\n";
      my_file << "ITEM: ATOMS id x y z ix iy iz Vor VorNeigh xx yy zz xy xz yz\n";
      
      // TODO: Here we can ask for a Voronoi tessellation of the simulation box in order to 
      //       calculate atomic volumes.
      
      my_file.precision(6);
      for (std::list <tNode>::iterator it = netw_app->network->nodes.begin();
           it != netw_app->network->nodes.end(); ++it){
         
         unsigned int ibead = (*it).Id - 1;
         
         my_file << (*it).Id << " " 
                 << b3D->bd_x[3*ibead + 0] << " "
                 << b3D->bd_x[3*ibead + 1] << " "
                 << b3D->bd_x[3*ibead + 2] << " "
                 << " 0 0 0 1.0 0 " 
                 << b3D->bd_stress[ibead][0] << " "
                 << b3D->bd_stress[ibead][1] << " "
                 << b3D->bd_stress[ibead][2] << " "
                 << b3D->bd_stress[ibead][3] << " "
                 << b3D->bd_stress[ibead][4] << " "
                 << b3D->bd_stress[ibead][5] << endl;
      }
   }